

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadSignalList(Psr_Man_t *p,Vec_Int_t *vTemp,char LastSymb,int fAddForm)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  vTemp->nSize = 0;
  pcVar1 = p->ErrorStr;
  do {
    iVar3 = Psr_ManReadSignal(p);
    if (iVar3 == 0) {
      if (*pcVar1 != '\0') {
LAB_003316b0:
        __assert_fail("!p->ErrorStr[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrs.h"
                      ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
      }
      builtin_strncpy(p->ErrorStr + 0x10,"al in the list.",0x10);
      uVar4._0_1_ = 'C';
      uVar4._1_1_ = 'a';
      uVar4._2_1_ = 'n';
      uVar4._3_1_ = 'n';
      uVar5._0_1_ = 'o';
      uVar5._1_1_ = 't';
      uVar5._2_1_ = ' ';
      uVar5._3_1_ = 'r';
      uVar6._0_1_ = 'e';
      uVar6._1_1_ = 'a';
      uVar6._2_1_ = 'd';
      uVar6._3_1_ = ' ';
      uVar7._0_1_ = 's';
      uVar7._1_1_ = 'i';
      uVar7._2_1_ = 'g';
      uVar7._3_1_ = 'n';
LAB_00331681:
      *(undefined4 *)pcVar1 = uVar4;
      *(undefined4 *)(p->ErrorStr + 4) = uVar5;
      *(undefined4 *)(p->ErrorStr + 8) = uVar6;
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar7;
      iVar3 = 1;
    }
    else {
      if (fAddForm != 0) {
        Vec_IntPush(vTemp,0);
      }
      Vec_IntPush(vTemp,iVar3);
      cVar2 = *p->pCur;
      iVar3 = 3;
      if (cVar2 != LastSymb) {
        if (cVar2 != ',') {
          if (*pcVar1 != '\0') goto LAB_003316b0;
          builtin_strncpy(p->ErrorStr + 0xd,"ma in the list.",0x10);
          uVar4._0_1_ = 'E';
          uVar4._1_1_ = 'x';
          uVar4._2_1_ = 'p';
          uVar4._3_1_ = 'e';
          uVar5._0_1_ = 'c';
          uVar5._1_1_ = 't';
          uVar5._2_1_ = 'i';
          uVar5._3_1_ = 'n';
          uVar6._0_1_ = 'g';
          uVar6._1_1_ = ' ';
          uVar6._2_1_ = 'c';
          uVar6._3_1_ = 'o';
          uVar7._0_1_ = 'm';
          uVar7._1_1_ = 'm';
          uVar7._2_1_ = 'a';
          uVar7._3_1_ = ' ';
          goto LAB_00331681;
        }
        p->pCur = p->pCur + 1;
        iVar3 = 0;
      }
    }
    if (iVar3 != 0) {
      return (uint)(iVar3 != 1);
    }
  } while( true );
}

Assistant:

int Psr_ManReadSignalList( Psr_Man_t * p, Vec_Int_t * vTemp, char LastSymb, int fAddForm )
{
    Vec_IntClear( vTemp );
    while ( 1 )
    {
        int Item = Psr_ManReadSignal(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Cannot read signal in the list.", 0);
        if ( fAddForm )
            Vec_IntPush( vTemp, 0 );
        Vec_IntPush( vTemp, Item );
        if ( Psr_ManIsChar(p, LastSymb) )   break;
        if ( !Psr_ManIsChar(p, ',') )       return Psr_ManErrorSet(p, "Expecting comma in the list.", 0);
        p->pCur++;
    }
    return 1;
}